

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_error.cpp
# Opt level: O2

CSVError *
duckdb::CSVError::ColumnTypesError
          (CSVError *__return_storage_ptr__,case_insensitive_map_t<idx_t> *sql_types_per_column,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *names)

{
  const_reference pvVar1;
  iterator iVar2;
  idx_t i;
  ulong __n;
  string *this;
  __node_base *p_Var3;
  string exception;
  LinesPerBoundary local_d0;
  LinesPerBoundary local_c0;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  for (__n = 0; __n < (ulong)((long)(names->
                                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(names->
                                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5); __n = __n + 1)
  {
    pvVar1 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ::get<true>(names,__n);
    iVar2 = ::std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&sql_types_per_column->_M_h,pvVar1);
    if (iVar2.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
        ._M_cur != (__node_type *)0x0) {
      pvVar1 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ::get<true>(names,__n);
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_M_erase(&sql_types_per_column->_M_h,pvVar1);
    }
  }
  if ((sql_types_per_column->_M_h)._M_element_count == 0) {
    ::std::__cxx11::string::string
              ((string *)&local_90,anon_var_dwarf_3b2a81b + 9,(allocator *)&exception);
    LinesPerBoundary::LinesPerBoundary(&local_c0);
    CSVError(__return_storage_ptr__,&local_90,COLUMN_NAME_TYPE_MISMATCH,local_c0);
    this = &local_90;
  }
  else {
    ::std::__cxx11::string::string
              ((string *)&exception,"COLUMN_TYPES error: Columns with names: ",
               (allocator *)&local_70);
    p_Var3 = &(sql_types_per_column->_M_h)._M_before_begin;
    while (p_Var3 = p_Var3->_M_nxt, p_Var3 != (__node_base *)0x0) {
      ::std::operator+(&local_50,"\"",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var3 + 1));
      ::std::operator+(&local_70,&local_50,"\",");
      ::std::__cxx11::string::append((string *)&exception);
      ::std::__cxx11::string::~string((string *)&local_70);
      ::std::__cxx11::string::~string((string *)&local_50);
    }
    ::std::__cxx11::string::pop_back();
    ::std::__cxx11::string::append((char *)&exception);
    ::std::__cxx11::string::string((string *)&local_b0,(string *)&exception);
    LinesPerBoundary::LinesPerBoundary(&local_d0);
    CSVError(__return_storage_ptr__,&local_b0,COLUMN_NAME_TYPE_MISMATCH,local_d0);
    ::std::__cxx11::string::~string((string *)&local_b0);
    this = &exception;
  }
  ::std::__cxx11::string::~string((string *)this);
  return __return_storage_ptr__;
}

Assistant:

CSVError CSVError::ColumnTypesError(case_insensitive_map_t<idx_t> sql_types_per_column, const vector<string> &names) {
	for (idx_t i = 0; i < names.size(); i++) {
		auto it = sql_types_per_column.find(names[i]);
		if (it != sql_types_per_column.end()) {
			sql_types_per_column.erase(names[i]);
		}
	}
	if (sql_types_per_column.empty()) {
		return CSVError("", COLUMN_NAME_TYPE_MISMATCH, {});
	}
	string exception = "COLUMN_TYPES error: Columns with names: ";
	for (auto &col : sql_types_per_column) {
		exception += "\"" + col.first + "\",";
	}
	exception.pop_back();
	exception += " do not exist in the CSV File";
	return CSVError(exception, COLUMN_NAME_TYPE_MISMATCH, {});
}